

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::GregorianCalendar::handleComputeMonthStart
          (GregorianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int32_t iVar1;
  long lVar2;
  int64_t iVar3;
  bool bVar4;
  short local_5c;
  bool local_5a;
  int iStack_40;
  int32_t gregShift;
  int64_t julianDay;
  int64_t y;
  UBool isLeap;
  GregorianCalendar *nonConstThis;
  int32_t local_18;
  int32_t iStack_14;
  UBool param_3_local;
  int32_t month_local;
  int32_t eyear_local;
  GregorianCalendar *this_local;
  
  local_18 = month;
  iStack_14 = eyear;
  _month_local = this;
  if ((month < 0) || (0xb < month)) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&local_18);
    iStack_14 = iVar1 + iStack_14;
  }
  bVar4 = iStack_14 % 4 == 0;
  lVar2 = (long)iStack_14;
  iVar3 = ClockMath::floorDivide(lVar2 + -1,4);
  iStack_40 = (int)(lVar2 + -1) * 0x16d + (int)iVar3 + 0x1a444f;
  this->fIsGregorian = this->fGregorianCutoverYear <= iStack_14;
  if (this->fInvertGregorian != '\0') {
    this->fIsGregorian = (this->fIsGregorian != '\0' ^ 0xffU) & 1;
  }
  if (this->fIsGregorian != '\0') {
    local_5a = false;
    if (bVar4) {
      local_5a = iStack_14 % 100 != 0 || iStack_14 % 400 == 0;
    }
    bVar4 = local_5a;
    iVar1 = Grego::gregorianShift(iStack_14);
    iStack_40 = iVar1 + iStack_40;
  }
  if (local_18 != 0) {
    if (bVar4) {
      local_5c = kLeapNumDays[local_18];
    }
    else {
      local_5c = kNumDays[local_18];
    }
    iStack_40 = local_5c + iStack_40;
  }
  return iStack_40;
}

Assistant:

int32_t GregorianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month,

                                                   UBool /* useMonth */) const
{
    GregorianCalendar *nonConstThis = (GregorianCalendar*)this; // cast away const

    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        eyear += ClockMath::floorDivide(month, 12, month);
    }

    UBool isLeap = eyear%4 == 0;
    int64_t y = (int64_t)eyear-1;
    int64_t julianDay = 365*y + ClockMath::floorDivide(y, (int64_t)4) + (kJan1_1JulianDay - 3);

    nonConstThis->fIsGregorian = (eyear >= fGregorianCutoverYear);
#if defined (U_DEBUG_CAL)
    fprintf(stderr, "%s:%d: (hcms%d/%d) fIsGregorian %s, fInvertGregorian %s\n", 
        __FILE__, __LINE__, eyear,month, fIsGregorian?"T":"F", fInvertGregorian?"T":"F");
#endif
    if (fInvertGregorian) {
        nonConstThis->fIsGregorian = !fIsGregorian;
    }
    if (fIsGregorian) {
        isLeap = isLeap && ((eyear%100 != 0) || (eyear%400 == 0));
        // Add 2 because Gregorian calendar starts 2 days after
        // Julian calendar
        int32_t gregShift = Grego::gregorianShift(eyear);
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: (hcms%d/%d) gregorian shift of %d += %d\n", 
            __FILE__, __LINE__, eyear, month, julianDay, gregShift);
#endif
        julianDay += gregShift;
    }

    // At this point julianDay indicates the day BEFORE the first
    // day of January 1, <eyear> of either the Julian or Gregorian
    // calendar.

    if (month != 0) {
        julianDay += isLeap?kLeapNumDays[month]:kNumDays[month];
    }

    return static_cast<int32_t>(julianDay);
}